

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Combine<duckdb::ArgMinMaxState<int,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (ArgMinMaxState<int,_duckdb::hugeint_t> *source,
               ArgMinMaxState<int,_duckdb::hugeint_t> *target,AggregateInputData *param_3)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  
  if ((source->super_ArgMinMaxStateBase).is_initialized != true) {
    return;
  }
  if ((target->super_ArgMinMaxStateBase).is_initialized == true) {
    lVar2 = (source->value).upper;
    lVar3 = (target->value).upper;
    if ((lVar2 <= lVar3) && ((source->value).lower <= (target->value).lower || lVar2 != lVar3)) {
      return;
    }
  }
  bVar1 = (source->super_ArgMinMaxStateBase).arg_null;
  (target->super_ArgMinMaxStateBase).arg_null = bVar1;
  if (bVar1 == false) {
    target->arg = source->arg;
  }
  iVar4 = (source->value).upper;
  (target->value).lower = (source->value).lower;
  (target->value).upper = iVar4;
  (target->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}